

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int r1fgkf_(int *ido,int *ip,int *l1,int *idl1,double *cc,double *c1,double *c2,int *in1,double *ch,
           double *ch2,int *in2,double *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  double *pdVar41;
  long lVar42;
  double *pdVar43;
  double *pdVar44;
  long lVar45;
  ulong uVar46;
  int iVar47;
  double *pdVar48;
  long lVar49;
  long lVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double *local_198;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  
  iVar1 = *in1;
  lVar35 = (long)iVar1;
  iVar27 = *idl1;
  lVar32 = (long)iVar27;
  lVar23 = (long)~((iVar27 + 1) * iVar1);
  iVar2 = *ido;
  lVar38 = (long)iVar2;
  iVar14 = *l1;
  lVar24 = (long)iVar14;
  iVar21 = (iVar14 + 1) * iVar2 + 1;
  lVar28 = (long)~(iVar21 * iVar1);
  iVar3 = *ip;
  lVar36 = (long)iVar3;
  iVar15 = *in2;
  lVar29 = (long)iVar15;
  lVar16 = (long)~((iVar27 + 1) * iVar15);
  lVar17 = (long)~(iVar21 * iVar15);
  dVar51 = cos(6.283185307179586 / (double)iVar3);
  dVar52 = sin(6.283185307179586 / (double)iVar3);
  uVar4 = *ip;
  iVar21 = (int)((uVar4 - ((int)(uVar4 + 1) >> 0x1f)) + 1) >> 1;
  uVar7 = uVar4 + 2;
  uVar5 = *ido;
  iVar8 = (int)((uVar5 - ((int)(uVar5 - 1) >> 0x1f)) + -1) >> 1;
  lVar18 = (long)(int)uVar5;
  uVar6 = *idl1;
  uVar25 = (ulong)uVar6;
  if ((ulong)uVar5 == 1) {
    if (0 < (int)uVar6) {
      pdVar20 = c2 + (lVar32 + 1) * lVar35 + lVar23 + 1;
      pdVar31 = ch2 + (lVar32 + 1) * lVar29 + lVar16 + 1;
      do {
        *pdVar20 = *pdVar31;
        pdVar20 = pdVar20 + lVar35;
        pdVar31 = pdVar31 + lVar29;
        uVar25 = uVar25 - 1;
      } while (uVar25 != 0);
    }
  }
  else {
    if (0 < (int)uVar6) {
      pdVar20 = ch2 + (lVar32 + 1) * lVar29 + lVar16 + 1;
      pdVar31 = c2 + (lVar32 + 1) * lVar35 + lVar23 + 1;
      do {
        *pdVar20 = *pdVar31;
        pdVar20 = pdVar20 + lVar29;
        pdVar31 = pdVar31 + lVar35;
        uVar25 = uVar25 - 1;
      } while (uVar25 != 0);
    }
    if (1 < (int)uVar4) {
      iVar37 = *l1;
      lVar19 = (lVar24 * 2 + 1) * lVar38 + 1;
      pdVar20 = ch + lVar19 * lVar29 + lVar17 + 1;
      pdVar31 = c1 + lVar19 * lVar35 + lVar28 + 1;
      lVar19 = 2;
      do {
        pdVar41 = pdVar20;
        lVar40 = (ulong)(iVar37 + 1) - 1;
        pdVar34 = pdVar31;
        if (0 < iVar37) {
          do {
            *pdVar41 = *pdVar34;
            lVar40 = lVar40 + -1;
            pdVar41 = pdVar41 + lVar38 * lVar29;
            pdVar34 = pdVar34 + lVar38 * lVar35;
          } while (lVar40 != 0);
        }
        lVar19 = lVar19 + 1;
        pdVar20 = pdVar20 + lVar24 * lVar38 * lVar29;
        pdVar31 = pdVar31 + lVar24 * lVar38 * lVar35;
      } while (lVar19 != (ulong)uVar4 + 1);
    }
    iVar37 = *l1;
    if (iVar37 < iVar8) {
      if (1 < (int)uVar4) {
        lVar19 = (lVar24 * 2 + 1) * lVar38 + 3;
        local_f0 = ch + lVar19 * lVar29 + lVar17 + 1;
        local_148 = c1 + lVar19 * lVar35 + lVar28 + 1;
        iVar9 = (iVar14 * 2 + 1) * iVar2 + 2;
        iVar22 = iVar15 * iVar9;
        iVar9 = iVar9 * iVar1;
        iVar13 = 0;
        uVar25 = 2;
        do {
          if (0 < iVar37) {
            uVar46 = 1;
            local_198 = local_148;
            local_130 = local_f0;
            iVar12 = iVar9;
            iVar11 = iVar22;
            do {
              if (2 < (int)uVar5) {
                lVar19 = 3;
                pdVar20 = local_198;
                pdVar31 = local_130;
                iVar10 = iVar12;
                iVar47 = iVar11;
                do {
                  ch[lVar17 + (long)iVar47 + 1] =
                       wa[(long)iVar13 + lVar19 + -3] * c1[lVar28 + (long)iVar10 + 1] +
                       wa[(long)iVar13 + lVar19 + -2] * *pdVar20;
                  *pdVar31 = wa[(long)iVar13 + lVar19 + -3] * *pdVar20 -
                             c1[lVar28 + (long)iVar10 + 1] * wa[(long)iVar13 + lVar19 + -2];
                  lVar19 = lVar19 + 2;
                  pdVar31 = pdVar31 + lVar29 * 2;
                  pdVar20 = pdVar20 + lVar35 * 2;
                  iVar47 = iVar47 + iVar15 * 2;
                  iVar10 = iVar10 + iVar1 * 2;
                } while (lVar19 <= lVar18);
              }
              uVar46 = uVar46 + 1;
              local_130 = local_130 + lVar38 * lVar29;
              local_198 = local_198 + lVar38 * lVar35;
              iVar11 = iVar11 + iVar15 * iVar2;
              iVar12 = iVar12 + iVar1 * iVar2;
            } while (uVar46 != iVar37 + 1);
          }
          uVar25 = uVar25 + 1;
          iVar13 = iVar13 + uVar5;
          local_f0 = local_f0 + lVar24 * lVar38 * lVar29;
          local_148 = local_148 + lVar24 * lVar38 * lVar35;
          iVar22 = iVar22 + iVar15 * iVar14 * iVar2;
          iVar9 = iVar9 + iVar1 * iVar14 * iVar2;
        } while (uVar25 != uVar4 + 1);
      }
    }
    else if (1 < (int)uVar4) {
      lVar40 = (lVar24 * 2 + 1) * lVar38;
      lVar19 = lVar40 + 3;
      local_160 = c1 + lVar19 * lVar35 + lVar28 + 1;
      lVar26 = lVar24 * lVar38 * lVar35;
      lVar40 = lVar40 + 2;
      local_168 = c1 + lVar40 * lVar35 + lVar28 + 1;
      local_198 = (double *)0x0;
      lVar42 = 2;
      iVar14 = 0;
      do {
        if (2 < (int)uVar5) {
          lVar50 = 3;
          pdVar20 = local_168;
          lVar30 = (long)iVar14;
          pdVar31 = local_160;
          pdVar41 = local_198;
          do {
            if (0 < iVar37) {
              lVar49 = 0;
              lVar45 = (ulong)(iVar37 + 1) - 1;
              lVar33 = (long)pdVar41;
              do {
                *(double *)((long)ch + lVar33 + lVar17 * 8 + lVar40 * lVar29 * 8 + 8) =
                     wa[lVar30] * *(double *)((long)pdVar20 + lVar49) +
                     wa[lVar30 + 1] * *(double *)((long)pdVar31 + lVar49);
                *(double *)((long)ch + lVar33 + lVar17 * 8 + lVar19 * lVar29 * 8 + 8) =
                     wa[lVar30] * *(double *)((long)pdVar31 + lVar49) -
                     *(double *)((long)pdVar20 + lVar49) * wa[lVar30 + 1];
                lVar33 = lVar33 + lVar38 * lVar29 * 8;
                lVar49 = lVar49 + lVar38 * lVar35 * 8;
                lVar45 = lVar45 + -1;
              } while (lVar45 != 0);
            }
            lVar50 = lVar50 + 2;
            pdVar41 = (double *)((long)pdVar41 + lVar29 * 0x10);
            pdVar31 = pdVar31 + lVar35 * 2;
            pdVar20 = pdVar20 + lVar35 * 2;
            lVar30 = lVar30 + 2;
          } while (lVar50 <= lVar18);
        }
        lVar42 = lVar42 + 1;
        iVar14 = iVar14 + uVar5;
        local_198 = (double *)((long)local_198 + lVar24 * lVar38 * lVar29 * 8);
        local_160 = local_160 + lVar26;
        local_168 = local_168 + lVar26;
      } while (lVar42 != (ulong)uVar4 + 1);
    }
    if (iVar8 < iVar37) {
      if (2 < (int)uVar4) {
        iVar14 = 2;
        if (2 < iVar21) {
          iVar14 = iVar21;
        }
        lVar26 = (((ulong)uVar7 - 2) * lVar24 + 1) * lVar38;
        lVar19 = lVar26 + 3;
        local_130 = c1 + lVar19 * lVar35 + lVar28 + 1;
        lVar42 = lVar24 * lVar38 * lVar35;
        lVar26 = lVar26 + 2;
        lVar30 = (lVar24 * 2 + 1) * lVar38;
        lVar40 = lVar30 + 3;
        lVar30 = lVar30 + 2;
        local_160 = ch + lVar19 * lVar29 + lVar17 + 1;
        lVar19 = lVar24 * lVar38 * lVar29;
        local_168 = c1 + lVar26 * lVar35 + lVar28 + 1;
        local_138 = ch + lVar26 * lVar29 + lVar17 + 1;
        local_120 = c1 + lVar40 * lVar35 + lVar28 + 1;
        local_128 = ch + lVar40 * lVar29 + lVar17 + 1;
        local_148 = c1 + lVar30 * lVar35 + lVar28 + 1;
        local_170 = ch + lVar30 * lVar29 + lVar17 + 1;
        uVar25 = 2;
        do {
          if (2 < (int)uVar5) {
            lVar40 = 3;
            pdVar20 = local_130;
            pdVar31 = local_138;
            pdVar41 = local_120;
            pdVar34 = local_148;
            pdVar39 = local_160;
            pdVar43 = local_168;
            pdVar44 = local_170;
            pdVar48 = local_128;
            do {
              if (0 < iVar37) {
                lVar50 = 0;
                lVar30 = 0;
                lVar26 = (ulong)(iVar37 + 1) - 1;
                do {
                  *(double *)((long)pdVar34 + lVar30) =
                       *(double *)((long)pdVar44 + lVar50) + *(double *)((long)pdVar31 + lVar50);
                  *(double *)((long)pdVar43 + lVar30) =
                       *(double *)((long)pdVar48 + lVar50) - *(double *)((long)pdVar39 + lVar50);
                  *(double *)((long)pdVar41 + lVar30) =
                       *(double *)((long)pdVar48 + lVar50) + *(double *)((long)pdVar39 + lVar50);
                  *(double *)((long)pdVar20 + lVar30) =
                       *(double *)((long)pdVar31 + lVar50) - *(double *)((long)pdVar44 + lVar50);
                  lVar30 = lVar30 + lVar38 * lVar35 * 8;
                  lVar50 = lVar50 + lVar38 * lVar29 * 8;
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
              }
              lVar40 = lVar40 + 2;
              pdVar20 = pdVar20 + lVar35 * 2;
              pdVar39 = pdVar39 + lVar29 * 2;
              pdVar43 = pdVar43 + lVar35 * 2;
              pdVar31 = pdVar31 + lVar29 * 2;
              pdVar41 = pdVar41 + lVar35 * 2;
              pdVar48 = pdVar48 + lVar29 * 2;
              pdVar34 = pdVar34 + lVar35 * 2;
              pdVar44 = pdVar44 + lVar29 * 2;
            } while (lVar40 <= lVar18);
          }
          uVar25 = uVar25 + 1;
          local_130 = local_130 + -lVar42;
          local_160 = local_160 + -lVar19;
          local_168 = local_168 + -lVar42;
          local_138 = local_138 + -lVar19;
          local_120 = local_120 + lVar42;
          local_128 = local_128 + lVar19;
          local_148 = local_148 + lVar42;
          local_170 = local_170 + lVar19;
        } while (uVar25 != iVar14 + 1);
      }
    }
    else if (2 < (int)uVar4) {
      iVar14 = 2;
      if (2 < iVar21) {
        iVar14 = iVar21;
      }
      lVar30 = (((ulong)uVar7 - 2) * lVar24 + 1) * lVar38;
      lVar19 = lVar30 + 3;
      local_160 = c1 + lVar19 * lVar35 + lVar28 + 1;
      lVar42 = lVar24 * lVar38 * lVar35;
      lVar26 = lVar38 * lVar35;
      lVar50 = (lVar24 * 2 + 1) * lVar38;
      lVar40 = lVar50 + 3;
      lVar50 = lVar50 + 2;
      lVar30 = lVar30 + 2;
      local_168 = ch + lVar19 * lVar29 + lVar17 + 1;
      lVar19 = lVar24 * lVar38 * lVar29;
      lVar45 = lVar38 * lVar29;
      local_138 = c1 + lVar40 * lVar35 + lVar28 + 1;
      local_120 = ch + lVar40 * lVar29 + lVar17 + 1;
      local_128 = c1 + lVar50 * lVar35 + lVar28 + 1;
      local_148 = ch + lVar50 * lVar29 + lVar17 + 1;
      local_170 = c1 + lVar30 * lVar35 + lVar28 + 1;
      local_e8 = ch + lVar30 * lVar29 + lVar17 + 1;
      uVar25 = 2;
      do {
        if (0 < iVar37) {
          uVar46 = 1;
          pdVar20 = local_160;
          pdVar31 = local_138;
          pdVar41 = local_120;
          pdVar34 = local_170;
          pdVar39 = local_168;
          pdVar43 = local_e8;
          pdVar44 = local_148;
          pdVar48 = local_128;
          do {
            if (2 < (int)uVar5) {
              lVar40 = 3;
              lVar50 = 0;
              lVar30 = 0;
              do {
                *(double *)((long)pdVar48 + lVar30) =
                     *(double *)((long)pdVar44 + lVar50) + *(double *)((long)pdVar43 + lVar50);
                *(double *)((long)pdVar34 + lVar30) =
                     *(double *)((long)pdVar41 + lVar50) - *(double *)((long)pdVar39 + lVar50);
                *(double *)((long)pdVar31 + lVar30) =
                     *(double *)((long)pdVar41 + lVar50) + *(double *)((long)pdVar39 + lVar50);
                *(double *)((long)pdVar20 + lVar30) =
                     *(double *)((long)pdVar43 + lVar50) - *(double *)((long)pdVar44 + lVar50);
                lVar40 = lVar40 + 2;
                lVar30 = lVar30 + lVar35 * 0x10;
                lVar50 = lVar50 + lVar29 * 0x10;
              } while (lVar40 <= lVar18);
            }
            uVar46 = uVar46 + 1;
            pdVar20 = pdVar20 + lVar26;
            pdVar39 = pdVar39 + lVar45;
            pdVar31 = pdVar31 + lVar26;
            pdVar41 = pdVar41 + lVar45;
            pdVar48 = pdVar48 + lVar26;
            pdVar44 = pdVar44 + lVar45;
            pdVar34 = pdVar34 + lVar26;
            pdVar43 = pdVar43 + lVar45;
          } while (uVar46 != iVar37 + 1);
        }
        uVar25 = uVar25 + 1;
        local_160 = local_160 + -lVar42;
        local_168 = local_168 + -lVar19;
        local_138 = local_138 + lVar42;
        local_120 = local_120 + lVar19;
        local_128 = local_128 + lVar42;
        local_148 = local_148 + lVar19;
        local_170 = local_170 + -lVar42;
        local_e8 = local_e8 + -lVar19;
      } while (uVar25 != iVar14 + 1);
    }
  }
  if (2 < (int)uVar4) {
    iVar14 = *l1;
    iVar15 = 2;
    if (2 < iVar21) {
      iVar15 = iVar21;
    }
    lVar19 = (((ulong)uVar7 - 2) * lVar24 + 1) * lVar38 + 1;
    pdVar41 = c1 + lVar19 * lVar35 + lVar28;
    lVar42 = lVar24 * lVar38 * lVar35;
    pdVar20 = ch + lVar19 * lVar29 + lVar17;
    lVar40 = lVar24 * lVar38 * lVar29;
    lVar19 = (lVar24 * 2 + 1) * lVar38 + 1;
    pdVar34 = c1 + lVar19 * lVar35 + lVar28;
    pdVar31 = ch + lVar19 * lVar29 + lVar17;
    uVar25 = 2;
    do {
      if (0 < iVar14) {
        lVar19 = 8;
        lVar26 = 8;
        lVar28 = (ulong)(iVar14 + 1) - 1;
        do {
          *(double *)((long)pdVar34 + lVar26) =
               *(double *)((long)pdVar31 + lVar19) + *(double *)((long)pdVar20 + lVar19);
          *(double *)((long)pdVar41 + lVar26) =
               *(double *)((long)pdVar20 + lVar19) - *(double *)((long)pdVar31 + lVar19);
          lVar26 = lVar26 + lVar38 * lVar35 * 8;
          lVar19 = lVar19 + lVar38 * lVar29 * 8;
          lVar28 = lVar28 + -1;
        } while (lVar28 != 0);
      }
      uVar25 = uVar25 + 1;
      pdVar41 = pdVar41 + -lVar42;
      pdVar20 = pdVar20 + -lVar40;
      pdVar34 = pdVar34 + lVar42;
      pdVar31 = pdVar31 + lVar40;
    } while (uVar25 != iVar15 + 1);
  }
  if (2 < (int)uVar4) {
    iVar14 = *idl1;
    iVar15 = 3;
    if (3 < iVar21) {
      iVar15 = iVar21;
    }
    iVar37 = 2;
    if (2 < iVar21) {
      iVar37 = iVar21;
    }
    pdVar20 = ch2 + (((ulong)uVar7 - 2) * lVar32 + 1) * lVar29 + lVar16;
    pdVar31 = ch2 + (lVar32 * 2 + 1) * lVar29 + lVar16;
    lVar28 = (ulong)(iVar14 + 1) - 1;
    dVar53 = 0.0;
    dVar55 = 1.0;
    uVar25 = 2;
    do {
      dVar54 = dVar53 * -dVar52;
      dVar53 = dVar55 * dVar52 + dVar51 * dVar53;
      dVar55 = dVar54 + dVar51 * dVar55;
      if (0 < iVar14) {
        lVar40 = 8;
        lVar19 = lVar28;
        pdVar41 = c2 + (lVar32 + 1) * lVar35 + 1;
        pdVar34 = c2 + ((long)(int)(iVar27 * uVar4) + 1) * lVar35 + 1;
        pdVar39 = c2 + ((long)(iVar27 * 2) + 1) * lVar35 + 1;
        do {
          *(double *)((long)pdVar31 + lVar40) = pdVar39[lVar23] * dVar55 + pdVar41[lVar23];
          *(double *)((long)pdVar20 + lVar40) = pdVar34[lVar23] * dVar53;
          lVar40 = lVar40 + lVar29 * 8;
          pdVar34 = pdVar34 + lVar35;
          pdVar39 = pdVar39 + lVar35;
          pdVar41 = pdVar41 + lVar35;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
      if (4 < (int)uVar4) {
        uVar46 = 3;
        pdVar41 = c2 + (lVar32 * 3 + 1) * lVar35 + lVar23;
        pdVar34 = c2 + (((ulong)uVar7 - 3) * lVar32 + 1) * lVar35 + lVar23;
        dVar54 = dVar53;
        dVar57 = dVar55;
        do {
          dVar56 = dVar54 * -dVar53;
          dVar54 = dVar57 * dVar53 + dVar55 * dVar54;
          dVar57 = dVar56 + dVar55 * dVar57;
          if (0 < iVar14) {
            lVar40 = 8;
            lVar42 = 8;
            lVar19 = lVar28;
            do {
              *(double *)((long)pdVar31 + lVar42) =
                   *(double *)((long)pdVar41 + lVar40) * dVar57 +
                   *(double *)((long)pdVar31 + lVar42);
              *(double *)((long)pdVar20 + lVar42) =
                   *(double *)((long)pdVar34 + lVar40) * dVar54 +
                   *(double *)((long)pdVar20 + lVar42);
              lVar42 = lVar42 + lVar29 * 8;
              lVar40 = lVar40 + lVar35 * 8;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          uVar46 = uVar46 + 1;
          pdVar34 = pdVar34 + -(lVar32 * lVar35);
          pdVar41 = pdVar41 + lVar32 * lVar35;
        } while (uVar46 != iVar15 + 1);
      }
      uVar25 = uVar25 + 1;
      pdVar20 = pdVar20 + -(lVar32 * lVar29);
      pdVar31 = pdVar31 + lVar32 * lVar29;
    } while (uVar25 != iVar37 + 1);
  }
  if (2 < (int)uVar4) {
    iVar27 = *idl1;
    iVar14 = 2;
    if (2 < iVar21) {
      iVar14 = iVar21;
    }
    pdVar20 = c2 + lVar23 + (lVar32 * 2 + 1) * lVar35 + 1;
    uVar25 = 2;
    do {
      pdVar31 = pdVar20;
      lVar23 = (ulong)(iVar27 + 1) - 1;
      pdVar41 = ch2 + (lVar32 + 1) * lVar29 + lVar16 + 1;
      if (0 < iVar27) {
        do {
          *pdVar41 = *pdVar31 + *pdVar41;
          lVar23 = lVar23 + -1;
          pdVar31 = pdVar31 + lVar35;
          pdVar41 = pdVar41 + lVar29;
        } while (lVar23 != 0);
      }
      uVar25 = uVar25 + 1;
      pdVar20 = pdVar20 + lVar32 * lVar35;
    } while (uVar25 != iVar14 + 1);
  }
  lVar16 = (long)(~((iVar3 + 1) * iVar2) * iVar1 + -1);
  uVar6 = *l1;
  if ((int)uVar5 < (int)uVar6) {
    if (0 < (int)uVar5) {
      pdVar20 = cc + ((lVar36 + 1) * lVar38 + 1) * lVar35 + lVar16 + 1;
      pdVar31 = ch + ((lVar24 + 1) * lVar38 + 1) * lVar29 + lVar17 + 1;
      lVar23 = 1;
      do {
        lVar28 = (ulong)(uVar6 + 1) - 1;
        pdVar41 = pdVar31;
        pdVar34 = pdVar20;
        if (0 < (int)uVar6) {
          do {
            *pdVar34 = *pdVar41;
            lVar28 = lVar28 + -1;
            pdVar41 = pdVar41 + lVar38 * lVar29;
            pdVar34 = pdVar34 + lVar36 * lVar38 * lVar35;
          } while (lVar28 != 0);
        }
        lVar23 = lVar23 + 1;
        pdVar20 = pdVar20 + lVar35;
        pdVar31 = pdVar31 + lVar29;
      } while (lVar23 != (ulong)uVar5 + 1);
    }
  }
  else if (0 < (int)uVar6) {
    pdVar20 = cc + ((lVar36 + 1) * lVar38 + 1) * lVar35 + lVar16 + 1;
    pdVar31 = ch + ((lVar24 + 1) * lVar38 + 1) * lVar29 + lVar17 + 1;
    lVar23 = 1;
    do {
      lVar28 = (ulong)(uVar5 + 1) - 1;
      pdVar41 = pdVar31;
      pdVar34 = pdVar20;
      if (0 < (int)uVar5) {
        do {
          *pdVar34 = *pdVar41;
          lVar28 = lVar28 + -1;
          pdVar41 = pdVar41 + lVar29;
          pdVar34 = pdVar34 + lVar35;
        } while (lVar28 != 0);
      }
      lVar23 = lVar23 + 1;
      pdVar20 = pdVar20 + lVar36 * lVar38 * lVar35;
      pdVar31 = pdVar31 + lVar38 * lVar29;
    } while (lVar23 != (ulong)uVar6 + 1);
  }
  if (2 < (int)uVar4) {
    iVar27 = 2;
    if (2 < iVar21) {
      iVar27 = iVar21;
    }
    pdVar20 = ch + ((((ulong)uVar7 - 2) * lVar24 + 1) * lVar38 + 1) * lVar29 + 1;
    lVar28 = lVar38 * lVar29;
    lVar32 = lVar16 * 8 + ((lVar36 + 3) * lVar38 + 1) * lVar35 * 8 + 8;
    lVar23 = lVar38 * lVar35 * 0x10;
    lVar19 = lVar16 * 8 + ((lVar36 + 2) * lVar38 + lVar18) * lVar35 * 8 + 8;
    pdVar31 = ch + ((lVar24 * 2 + 1) * lVar38 + 1) * lVar29 + 1;
    uVar25 = 2;
    do {
      lVar40 = (ulong)(uVar6 + 1) - 1;
      pdVar41 = cc;
      pdVar34 = pdVar20;
      pdVar39 = pdVar31;
      if (0 < (int)uVar6) {
        do {
          *(double *)((long)pdVar41 + lVar19) = pdVar39[lVar17];
          *(double *)((long)pdVar41 + lVar32) = pdVar34[lVar17];
          lVar40 = lVar40 + -1;
          pdVar41 = pdVar41 + lVar38 * lVar35 * lVar36;
          pdVar34 = pdVar34 + lVar28;
          pdVar39 = pdVar39 + lVar28;
        } while (lVar40 != 0);
      }
      uVar25 = uVar25 + 1;
      pdVar20 = pdVar20 + -(lVar28 * lVar24);
      lVar32 = lVar32 + lVar23;
      lVar19 = lVar19 + lVar23;
      pdVar31 = pdVar31 + lVar28 * lVar24;
    } while (uVar25 != iVar27 + 1);
  }
  if (uVar5 != 1) {
    if (iVar8 < (int)uVar6) {
      if (2 < (int)uVar4) {
        iVar27 = 2;
        if (2 < iVar21) {
          iVar27 = iVar21;
        }
        lVar32 = lVar38 * lVar35;
        lVar23 = (lVar36 + 3) * lVar38;
        local_b8 = cc + ((long)(int)(uVar5 + 2) + (lVar36 + 2) * lVar38 + -4) * lVar35 + lVar16;
        local_148 = cc + (lVar23 + 3) * lVar35 + lVar16;
        local_d0 = cc + (lVar23 + 2) * lVar35 + lVar16;
        lVar23 = (((ulong)uVar7 - 2) * lVar24 + 1) * lVar38;
        lVar28 = lVar38 * lVar29 * lVar24;
        lVar24 = (lVar24 * 2 + 1) * lVar38;
        local_140 = ch + (lVar23 + 3) * lVar29 + lVar17 + 1;
        local_170 = ch + (lVar23 + 2) * lVar29 + lVar17 + 1;
        local_e8 = ch + (lVar24 + 3) * lVar29 + lVar17 + 1;
        local_f0 = ch + (lVar24 + 2) * lVar29 + lVar17 + 1;
        iVar14 = ((iVar3 + 2) * iVar2 + uVar5 + -1) * iVar1;
        uVar25 = 2;
        do {
          if (2 < (int)uVar5) {
            lVar17 = 3;
            pdVar20 = local_140;
            pdVar31 = local_f0;
            pdVar41 = local_170;
            pdVar34 = local_e8;
            pdVar39 = local_b8;
            pdVar43 = local_148;
            pdVar44 = local_d0;
            iVar15 = iVar14;
            do {
              if (0 < (int)uVar6) {
                lVar24 = 8;
                lVar19 = 0;
                lVar23 = (ulong)(uVar6 + 1) - 1;
                iVar21 = iVar15;
                do {
                  *(double *)((long)pdVar44 + lVar24) =
                       *(double *)((long)pdVar31 + lVar19) + *(double *)((long)pdVar41 + lVar19);
                  *(double *)((long)pdVar39 + lVar24) =
                       *(double *)((long)pdVar31 + lVar19) - *(double *)((long)pdVar41 + lVar19);
                  *(double *)((long)pdVar43 + lVar24) =
                       *(double *)((long)pdVar34 + lVar19) + *(double *)((long)pdVar20 + lVar19);
                  cc[lVar16 + (long)iVar21 + 1] =
                       *(double *)((long)pdVar20 + lVar19) - *(double *)((long)pdVar34 + lVar19);
                  iVar21 = iVar21 + iVar1 * iVar3 * iVar2;
                  lVar24 = lVar24 + lVar32 * lVar36 * 8;
                  lVar19 = lVar19 + lVar38 * lVar29 * 8;
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
              lVar17 = lVar17 + 2;
              iVar15 = iVar15 + iVar1 * -2;
              pdVar39 = pdVar39 + lVar35 * -2;
              pdVar43 = pdVar43 + lVar35 * 2;
              pdVar44 = pdVar44 + lVar35 * 2;
              pdVar20 = pdVar20 + lVar29 * 2;
              pdVar41 = pdVar41 + lVar29 * 2;
              pdVar34 = pdVar34 + lVar29 * 2;
              pdVar31 = pdVar31 + lVar29 * 2;
            } while (lVar17 <= lVar18);
          }
          uVar25 = uVar25 + 1;
          iVar14 = iVar14 + iVar1 * iVar2 * 2;
          local_b8 = local_b8 + lVar32 * 2;
          local_148 = local_148 + lVar32 * 2;
          local_d0 = local_d0 + lVar32 * 2;
          local_140 = local_140 + -lVar28;
          local_170 = local_170 + -lVar28;
          local_e8 = local_e8 + lVar28;
          local_f0 = local_f0 + lVar28;
        } while (uVar25 != iVar27 + 1);
      }
    }
    else if (2 < (int)uVar4) {
      iVar27 = 2;
      if (2 < iVar21) {
        iVar27 = iVar21;
      }
      lVar28 = (lVar36 + 3) * lVar38;
      lVar42 = lVar38 * lVar35;
      lVar26 = lVar42 * lVar36;
      lVar32 = (((ulong)uVar7 - 2) * lVar24 + 1) * lVar38;
      lVar19 = lVar38 * lVar29;
      lVar40 = lVar19 * lVar24;
      lVar23 = (lVar24 * 2 + 1) * lVar38;
      local_e8 = ch + (lVar32 + 3) * lVar29 + lVar17 + 1;
      local_f0 = ch + (lVar23 + 3) * lVar29 + lVar17 + 1;
      local_f8 = ch + (lVar23 + 2) * lVar29 + lVar17 + 1;
      local_d8 = ch + (lVar32 + 2) * lVar29 + lVar17 + 1;
      local_c0 = cc + (lVar28 + 3) * lVar35 + lVar16 + 1;
      local_c8 = cc + ((long)(int)(uVar5 + 2) + (lVar36 + 2) * lVar38 + -3) * lVar35 + lVar16 + 1;
      local_b0 = cc + (lVar28 + 2) * lVar35 + lVar16 + 1;
      iVar14 = ((iVar3 + 2) * iVar2 + uVar5 + -2) * iVar1;
      uVar25 = 2;
      do {
        if (0 < (int)uVar6) {
          uVar46 = 1;
          local_160 = local_c8;
          pdVar20 = local_c0;
          pdVar31 = local_e8;
          pdVar41 = local_d8;
          pdVar34 = local_b0;
          pdVar39 = local_f8;
          pdVar43 = local_f0;
          iVar15 = iVar14;
          do {
            if (2 < (int)uVar5) {
              lVar17 = 3;
              lVar24 = 0;
              lVar23 = 0;
              pdVar44 = local_160;
              iVar21 = iVar15;
              do {
                *(double *)((long)pdVar34 + lVar23) =
                     *(double *)((long)pdVar39 + lVar24) + *(double *)((long)pdVar41 + lVar24);
                cc[lVar16 + (long)iVar21 + 1] =
                     *(double *)((long)pdVar39 + lVar24) - *(double *)((long)pdVar41 + lVar24);
                *(double *)((long)pdVar20 + lVar23) =
                     *(double *)((long)pdVar43 + lVar24) + *(double *)((long)pdVar31 + lVar24);
                *pdVar44 = *(double *)((long)pdVar31 + lVar24) - *(double *)((long)pdVar43 + lVar24)
                ;
                lVar17 = lVar17 + 2;
                lVar23 = lVar23 + lVar35 * 0x10;
                lVar24 = lVar24 + lVar29 * 0x10;
                iVar21 = iVar21 + iVar1 * -2;
                pdVar44 = pdVar44 + lVar35 * -2;
              } while (lVar17 <= lVar18);
            }
            uVar46 = uVar46 + 1;
            pdVar20 = pdVar20 + lVar26;
            pdVar31 = pdVar31 + lVar19;
            pdVar43 = pdVar43 + lVar19;
            iVar15 = iVar15 + iVar1 * iVar3 * iVar2;
            local_160 = local_160 + lVar26;
            pdVar39 = pdVar39 + lVar19;
            pdVar41 = pdVar41 + lVar19;
            pdVar34 = pdVar34 + lVar26;
          } while (uVar46 != uVar6 + 1);
        }
        uVar25 = uVar25 + 1;
        local_c0 = local_c0 + lVar42 * 2;
        local_e8 = local_e8 + -lVar40;
        local_f0 = local_f0 + lVar40;
        iVar14 = iVar14 + iVar1 * iVar2 * 2;
        local_c8 = local_c8 + lVar42 * 2;
        local_f8 = local_f8 + lVar40;
        local_d8 = local_d8 + -lVar40;
        local_b0 = local_b0 + lVar42 * 2;
      } while (uVar25 != iVar27 + 1);
    }
  }
  return 0;
}

Assistant:

int r1fgkf_(int *ido, int *ip, int *l1, int *
	idl1, fft_real_t *cc, fft_real_t *c1, fft_real_t *c2, int *in1, fft_real_t *ch, fft_real_t *ch2,
	 int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, c1_dim1, c1_dim2, c1_dim3, c1_offset, c2_dim1, c2_dim2,
	     c2_offset, ch2_dim1, ch2_dim2, ch2_offset, i__1, i__2, i__3;

    /* Builtin functions */

    /* Local variables */
     int i__, j, k, l, j2, ic, jc, lc, ik, is;
     fft_real_t dc2, ai1, ai2, ar1, ar2, ds2;
     int nbd;
     fft_real_t dcp, arg, dsp, tpi, ar1h, ar2h;
     int idp2, ipp2, idij, ipph;


    /* Parameter adjustments */
    --wa;
    c2_dim1 = *in1;
    c2_dim2 = *idl1;
    c2_offset = 1 + c2_dim1 * (1 + c2_dim2);
    c2 -= c2_offset;
    c1_dim1 = *in1;
    c1_dim2 = *ido;
    c1_dim3 = *l1;
    c1_offset = 1 + c1_dim1 * (1 + c1_dim2 * (1 + c1_dim3));
    c1 -= c1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch2_dim1 = *in2;
    ch2_dim2 = *idl1;
    ch2_offset = 1 + ch2_dim1 * (1 + ch2_dim2);
    ch2 -= ch2_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_dim3 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    tpi = atan(1.0) * 8.0;
    arg = tpi / (fft_real_t) (*ip);
    dcp = cos(arg);
    dsp = sin(arg);
    ipph = (*ip + 1) / 2;
    ipp2 = *ip + 2;
    idp2 = *ido + 2;
    nbd = (*ido - 1) / 2;
    if (*ido == 1) {
	goto L119;
    }
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	ch2[(ik + ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) * c2_dim1 + 1]
		;
/* L101: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ch[((k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] = c1[((k + j *
		     c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1];
/* L102: */
	}
/* L103: */
    }
    if (nbd > *l1) {
	goto L107;
    }
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	idij = is;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    idij += 2;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L104: */
	    }
/* L105: */
	}
/* L106: */
    }
    goto L111;
L107:
    is = -(*ido);
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	is += *ido;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    idij = is;
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		idij += 2;
		ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] =
			wa[idij - 1] * c1[(i__ - 1 + (k + j * c1_dim3) *
			c1_dim2) * c1_dim1 + 1] + wa[idij] * c1[(i__ + (k + j
			* c1_dim3) * c1_dim2) * c1_dim1 + 1];
		ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] = wa[
			idij - 1] * c1[(i__ + (k + j * c1_dim3) * c1_dim2) *
			c1_dim1 + 1] - wa[idij] * c1[(i__ - 1 + (k + j *
			c1_dim3) * c1_dim2) * c1_dim1 + 1];
/* L108: */
	    }
/* L109: */
	}
/* L110: */
    }
L111:
    if (nbd < *l1) {
	goto L115;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L112: */
	    }
/* L113: */
	}
/* L114: */
    }
    goto L121;
L115:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		c1[(i__ - 1 + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) * ch_dim1
			+ 1] + ch[(i__ - 1 + (k + jc * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
		c1[(i__ - 1 + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			- ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		c1[(i__ + (k + j * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1] +
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			;
		c1[(i__ + (k + jc * c1_dim3) * c1_dim2) * c1_dim1 + 1] = ch[(
			i__ - 1 + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1];
/* L116: */
	    }
/* L117: */
	}
/* L118: */
    }
    goto L121;
L119:
    i__1 = *idl1;
    for (ik = 1; ik <= i__1; ++ik) {
	c2[(ik + c2_dim2) * c2_dim1 + 1] = ch2[(ik + ch2_dim2) * ch2_dim1 + 1]
		;
/* L120: */
    }
L121:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    c1[((k + j * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] + ch[((k + jc *
		    ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    c1[((k + jc * c1_dim3) * c1_dim2 + 1) * c1_dim1 + 1] = ch[((k +
		    jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1] - ch[((k + j *
		     ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L122: */
	}
/* L123: */
    }

    ar1 = 1.0;
    ai1 = 0.0;
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	ar1h = dcp * ar1 - dsp * ai1;
	ai1 = dcp * ai1 + dsp * ar1;
	ar1 = ar1h;
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] = c2[(ik + c2_dim2) *
		    c2_dim1 + 1] + ar1 * c2[(ik + (c2_dim2 << 1)) * c2_dim1 +
		    1];
	    ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] = ai1 * c2[(ik + *ip *
		    c2_dim2) * c2_dim1 + 1];
/* L124: */
	}
	dc2 = ar1;
	ds2 = ai1;
	ar2 = ar1;
	ai2 = ai1;
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    ar2h = dc2 * ar2 - ds2 * ai2;
	    ai2 = dc2 * ai2 + ds2 * ar2;
	    ar2 = ar2h;
	    i__3 = *idl1;
	    for (ik = 1; ik <= i__3; ++ik) {
		ch2[(ik + l * ch2_dim2) * ch2_dim1 + 1] += ar2 * c2[(ik + j *
			c2_dim2) * c2_dim1 + 1];
		ch2[(ik + lc * ch2_dim2) * ch2_dim1 + 1] += ai2 * c2[(ik + jc
			* c2_dim2) * c2_dim1 + 1];
/* L125: */
	    }
/* L126: */
	}
/* L127: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *idl1;
	for (ik = 1; ik <= i__2; ++ik) {
	    ch2[(ik + ch2_dim2) * ch2_dim1 + 1] += c2[(ik + j * c2_dim2) *
		    c2_dim1 + 1];
/* L128: */
	}
/* L129: */
    }

    if (*ido < *l1) {
	goto L132;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L130: */
	}
/* L131: */
    }
    goto L135;
L132:
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(i__ + (k * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(i__ +
		    (k + ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L133: */
	}
/* L134: */
    }
L135:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(*ido + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(
		    (k + j * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
	    cc[((j2 - 1 + k * cc_dim3) * cc_dim2 + 1) * cc_dim1 + 1] = ch[((k
		    + jc * ch_dim3) * ch_dim2 + 1) * ch_dim1 + 1];
/* L136: */
	}
/* L137: */
    }
    if (*ido == 1) {
	return 0;
    }
    if (nbd < *l1) {
	goto L141;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    i__3 = *ido;
	    for (i__ = 3; i__ <= i__3; i__ += 2) {
		ic = idp2 - i__;
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L138: */
	    }
/* L139: */
	}
/* L140: */
    }
    return 0;
L141:
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	j2 = j + j;
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(i__ - 1 + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			 = ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] + ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(ic - 1 + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1]
			= ch[(i__ - 1 + (k + j * ch_dim3) * ch_dim2) *
			ch_dim1 + 1] - ch[(i__ - 1 + (k + jc * ch_dim3) *
			ch_dim2) * ch_dim1 + 1];
		cc[(i__ + (j2 - 1 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			+ ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
		cc[(ic + (j2 - 2 + k * cc_dim3) * cc_dim2) * cc_dim1 + 1] =
			ch[(i__ + (k + jc * ch_dim3) * ch_dim2) * ch_dim1 + 1]
			 - ch[(i__ + (k + j * ch_dim3) * ch_dim2) * ch_dim1 +
			1];
/* L142: */
	    }
/* L143: */
	}
/* L144: */
    }
    return 0;
}